

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_short&>(String *__return_storage_ptr__,kj *this,unsigned_short *params)

{
  CappedArray<char,_8UL> local_18;
  
  local_18 = toCharSequence<unsigned_short&>((unsigned_short *)this);
  _::concat<kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_18,(CappedArray<char,_8UL> *)local_18.content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}